

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O0

void __thiscall ON_DimStyle::SetFont(ON_DimStyle *this,ON_Font *font_characteristics)

{
  bool bVar1;
  int iVar2;
  bool local_59;
  undefined1 local_40 [30];
  Origin local_22;
  FontType local_21;
  bool bFontChanged;
  ON_wString OStack_20;
  bool bManagedFontChanged;
  ON_Font *managed_font;
  ON_Font *font_characteristics_local;
  ON_DimStyle *this_local;
  
  managed_font = font_characteristics;
  font_characteristics_local = (ON_Font *)this;
  OStack_20.m_s = (wchar_t *)ON_Font::ManagedFont(font_characteristics);
  if ((ON_Font *)OStack_20.m_s == (ON_Font *)0x0) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_dimensionstyle.cpp"
               ,0xda7,"","ON_Font::GetManagedFont(font_characteristics) failed.");
  }
  else {
    local_21 = this->m_managed_font != (ON_Font *)OStack_20.m_s;
    local_40[0xf] = 0;
    bVar1 = false;
    local_59 = true;
    if (!(bool)local_21) {
      iVar2 = ON_Font::CompareFontCharacteristics(managed_font,&this->m_font_characteristics);
      local_59 = true;
      if (iVar2 == 0) {
        ON_Font::Description((ON_Font *)(local_40 + 0x10));
        local_40[0xf] = 1;
        ON_Font::Description((ON_Font *)local_40);
        bVar1 = true;
        local_59 = ::operator!=((ON_wString *)(local_40 + 0x10),(ON_wString *)local_40);
      }
    }
    if (bVar1) {
      ON_wString::~ON_wString((ON_wString *)local_40);
    }
    if ((local_40[0xf] & 1) != 0) {
      ON_wString::~ON_wString((ON_wString *)(local_40 + 0x10));
    }
    local_22 = local_59;
    ON_Font::operator=(&this->m_font_characteristics,managed_font);
    if ((local_22 & Unknown) != Unset) {
      this->m_managed_font = (ON_Font *)OStack_20.m_s;
      Internal_TextPositionPropertiesChange(this);
    }
    Internal_SetOverrideDimStyleCandidateFieldOverride(this,Font);
  }
  return;
}

Assistant:

void ON_DimStyle::SetFont(
  const ON_Font& font_characteristics
)
{
  const ON_Font* managed_font = font_characteristics.ManagedFont();
  if (nullptr == managed_font)
  {
    ON_ERROR("ON_Font::GetManagedFont(font_characteristics) failed.");
    return;
  }

  const bool bManagedFontChanged = (m_managed_font != managed_font);

  const bool bFontChanged
    = bManagedFontChanged
    || (0 != ON_Font::CompareFontCharacteristics(font_characteristics, m_font_characteristics))
    || m_font_characteristics.Description() != font_characteristics.Description()
    ;

  // copy font_characteristics unconditionally in case compare missed some detail.
  m_font_characteristics = font_characteristics;

  if (bFontChanged)
  {
    m_managed_font = managed_font;
    Internal_TextPositionPropertiesChange();
  }

  Internal_SetOverrideDimStyleCandidateFieldOverride(ON_DimStyle::field::Font);
}